

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O0

Desc * __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Desc::operator=(Desc *this,Desc *rhs)

{
  Desc *in_RSI;
  Desc *in_RDI;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *unaff_retaddr;
  Desc *rhs_00;
  
  if (in_RDI != in_RSI) {
    rhs_00 = in_RDI;
    DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
    ::operator=(unaff_retaddr,&in_RDI->rowstat);
    DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
    ::operator=(unaff_retaddr,&rhs_00->rowstat);
    if ((Desc *)in_RSI->stat == in_RSI) {
      in_RDI->stat = &in_RDI->rowstat;
      in_RDI->costat = &in_RDI->colstat;
    }
    else {
      in_RDI->stat = &in_RDI->colstat;
      in_RDI->costat = &in_RDI->rowstat;
    }
  }
  return in_RDI;
}

Assistant:

typename SPxBasisBase<R>::Desc& SPxBasisBase<R>::Desc::operator=(const typename
      SPxBasisBase<R>::Desc& rhs)
{
   if(this != &rhs)
   {
      rowstat = rhs.rowstat;
      colstat = rhs.colstat;

      if(rhs.stat == &rhs.rowstat)
      {
         assert(rhs.costat == &rhs.colstat);

         stat   = &rowstat;
         costat = &colstat;
      }
      else
      {
         assert(rhs.costat == &rhs.rowstat);

         stat   = &colstat;
         costat = &rowstat;
      }

      assert(Desc::isConsistent());
   }

   return *this;
}